

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O2

wchar_t * StringFromPropType(Types vt)

{
  if (vt - Bool < 0xd) {
    return (wchar_t *)(&DAT_006e4464 + *(int *)(&DAT_006e4464 + (ulong)(vt - Bool) * 4));
  }
  return L"null";
}

Assistant:

static const wchar_t* StringFromPropType(ON_XMLVariant::Types vt)
{
  switch (vt)
  {
  case ON_XMLVariant::Types::Integer:      return L"int";
  case ON_XMLVariant::Types::Float:        return L"float";
  case ON_XMLVariant::Types::Double:       return L"double";
  case ON_XMLVariant::Types::String:       return L"string";
  case ON_XMLVariant::Types::Bool:         return L"bool";
  case ON_XMLVariant::Types::Matrix:       return L"matrix";
  case ON_XMLVariant::Types::Uuid:         return L"uuid";
  case ON_XMLVariant::Types::Time:         return L"time";
  case ON_XMLVariant::Types::Buffer:       return L"buffer";
  case ON_XMLVariant::Types::DoubleColor4: return L"color";
  case ON_XMLVariant::Types::DoubleArray2: return L"2da";
  case ON_XMLVariant::Types::DoubleArray3: return L"3da";
  case ON_XMLVariant::Types::DoubleArray4: return L"4da";
  case ON_XMLVariant::Types::Null:
  default:
    return L"null";
  }
}